

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.hpp
# Opt level: O3

void __thiscall ui::UI::add_layer(UI *this,string *name,Renderable *r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  layer_t local_48;
  
  paVar1 = &local_48.name.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  local_48.layer._M_t.super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>.
  _M_t.super__Tuple_impl<0UL,_ui::Renderable_*,_std::default_delete<ui::Renderable>_>.
  super__Head_base<0UL,_ui::Renderable_*,_false>._M_head_impl =
       (__uniq_ptr_data<ui::Renderable,_std::default_delete<ui::Renderable>,_true,_true>)
       (__uniq_ptr_data<ui::Renderable,_std::default_delete<ui::Renderable>,_true,_true>)r;
  std::vector<ui::layer_t,_std::allocator<ui::layer_t>_>::emplace_back<ui::layer_t>
            (&this->_layers,&local_48);
  if ((_Tuple_impl<0UL,_ui::Renderable_*,_std::default_delete<ui::Renderable>_>)
      local_48.layer._M_t.
      super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>._M_t.
      super__Tuple_impl<0UL,_ui::Renderable_*,_std::default_delete<ui::Renderable>_>.
      super__Head_base<0UL,_ui::Renderable_*,_false>._M_head_impl != (Renderable *)0x0) {
    (**(code **)(*(long *)local_48.layer._M_t.
                          super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ui::Renderable_*,_std::default_delete<ui::Renderable>_>
                          .super__Head_base<0UL,_ui::Renderable_*,_false>._M_head_impl + 0x20))();
  }
  local_48.layer._M_t.super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>.
  _M_t.super__Tuple_impl<0UL,_ui::Renderable_*,_std::default_delete<ui::Renderable>_>.
  super__Head_base<0UL,_ui::Renderable_*,_false>._M_head_impl =
       (__uniq_ptr_data<ui::Renderable,_std::default_delete<ui::Renderable>,_true,_true>)
       (__uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1);
  }
  (*(r->super_Area)._vptr_Area[8])(r,r);
  (*(r->super_Area)._vptr_Area[1])(r);
  (**(r->super_Area)._vptr_Area)(r);
  (*(r->super_Area)._vptr_Area[0xc])(r);
  return;
}

Assistant:

void add_layer(std::string name, Renderable *r) {
            _layers.push_back(layer_t {name, std::unique_ptr<Renderable>(r)});
            r->set_root(r);
            r->recalculate_dimension();
            r->recalculate_origin();
            r->show();
        }